

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::CalcTextSize(char *text,char *text_end,bool hide_text_after_double_hash,
                          float wrap_width)

{
  float size;
  char *pcVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 extraout_XMM0_Qb;
  
  if ((int)CONCAT71(in_register_00000011,hide_text_after_double_hash) != 0) {
    pcVar2 = (char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end);
    pcVar1 = text;
    if (pcVar2 <= text) {
      size = GImGui->FontSize;
      goto LAB_0010fd9d;
    }
    do {
      text_end = pcVar1;
      if (*pcVar1 == '#') {
        if (pcVar1[1] == '#') break;
      }
      else if (*pcVar1 == '\0') break;
      pcVar1 = pcVar1 + 1;
      text_end = pcVar2;
    } while (pcVar1 != pcVar2);
  }
  size = GImGui->FontSize;
  if (text_end != text) {
    auVar3._0_8_ = ImFont::CalcTextSizeA
                             (GImGui->Font,size,3.4028235e+38,wrap_width,text,text_end,(char **)0x0)
    ;
    auVar3._8_8_ = extraout_XMM0_Qb;
    auVar4._4_12_ = auVar3._4_12_;
    auVar4._0_4_ = (float)(int)(auVar3._0_4_ + 0.95);
    return auVar4._0_8_;
  }
LAB_0010fd9d:
  return (ImVec2)((ulong)(uint)size << 0x20);
}

Assistant:

ImVec2 ImGui::CalcTextSize(const char* text, const char* text_end, bool hide_text_after_double_hash, float wrap_width)
{
    ImGuiContext& g = *GImGui;

    const char* text_display_end;
    if (hide_text_after_double_hash)
        text_display_end = FindRenderedTextEnd(text, text_end);      // Hide anything after a '##' string
    else
        text_display_end = text_end;

    ImFont* font = g.Font;
    const float font_size = g.FontSize;
    if (text == text_display_end)
        return ImVec2(0.0f, font_size);
    ImVec2 text_size = font->CalcTextSizeA(font_size, FLT_MAX, wrap_width, text, text_display_end, NULL);

    // Round
    text_size.x = IM_FLOOR(text_size.x + 0.95f);

    return text_size;
}